

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_25::BinaryReader::ReadAlignment
          (BinaryReader *this,Address *alignment_log2,char *desc)

{
  Result RVar1;
  undefined8 in_RAX;
  Enum EVar2;
  uint32_t value;
  uint local_24;
  
  local_24 = (uint)((ulong)in_RAX >> 0x20);
  RVar1 = ReadU32Leb128(this,&local_24,desc);
  EVar2 = Error;
  if (RVar1.enum_ != Error) {
    if (((ulong)local_24 < 0x80) &&
       ((local_24 < 0x20 || ((this->options_->features).multi_memory_enabled_ != false)))) {
      *alignment_log2 = (ulong)local_24;
      EVar2 = Ok;
    }
    else {
      PrintError(this,"invalid %s: %u",desc);
    }
  }
  return (Result)EVar2;
}

Assistant:

Result BinaryReader::ReadAlignment(Address* alignment_log2, const char* desc) {
  uint32_t value;
  CHECK_RESULT(ReadU32Leb128(&value, desc));
  if (value >= 128 ||
      (value >= 32 && !options_.features.multi_memory_enabled())) {
    PrintError("invalid %s: %u", desc, value);
    return Result::Error;
  }
  *alignment_log2 = value;
  return Result::Ok;
}